

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu540c.c
# Opt level: O0

MPP_RET vepu540c_h265_setup_hal_bufs(H265eV540cHalContext *ctx)

{
  int iVar1;
  Vepu541Fmt VVar2;
  VepuFmtCfg *cfg;
  MppEncRefCfg ref;
  MppEncCfgSet *pMVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  MppEncCpbInfo *pMVar8;
  RK_S32 local_9c;
  int local_94;
  size_t local_88;
  size_t size [3];
  RK_S32 ext_line_buf_size;
  MppEncCpbInfo *info;
  RK_S32 aligned_w;
  RK_S32 alignment;
  RK_S32 new_max_cnt;
  RK_S32 old_max_cnt;
  MppEncPrepCfg *prep;
  MppEncRefCfg ref_cfg;
  RK_S32 mb_h64;
  RK_S32 mb_wd64;
  Vepu541Fmt input_fmt;
  RK_U32 frame_size;
  VepuFmtCfg *fmt;
  MPP_RET ret;
  H265eV540cHalContext *ctx_local;
  
  cfg = (VepuFmtCfg *)ctx->input_fmt;
  ref = ctx->cfg->ref_cfg;
  pMVar3 = ctx->cfg;
  iVar1 = ctx->max_buf_cnt;
  aligned_w = 2;
  uVar4 = (pMVar3->prep).width + 0x1fU & 0xffffffe0;
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","(%d) enter\n",(char *)0x0,0x89);
  }
  iVar7 = (pMVar3->prep).width;
  iVar5 = iVar7 + 0x3f;
  if (iVar5 < 0) {
    iVar5 = iVar7 + 0x7e;
  }
  iVar5 = iVar5 >> 6;
  iVar7 = (pMVar3->prep).height;
  iVar6 = iVar7 + 0x3f;
  if (iVar6 < 0) {
    iVar6 = iVar7 + 0x7e;
  }
  iVar6 = iVar6 >> 6;
  mb_wd64 = ((pMVar3->prep).width + 0xfU & 0xffffff0) * ((pMVar3->prep).height + 0xfU & 0xfffffff0);
  vepu541_set_fmt(cfg,(ctx->cfg->prep).format);
  VVar2 = cfg->format;
  switch(VVar2) {
  case VEPU541_FMT_BGRA8888:
    mb_wd64 = mb_wd64 * 4;
    break;
  case VEPU541_FMT_BGR888:
    mb_wd64 = mb_wd64 * 3;
    break;
  case VEPU541_FMT_BGR565:
  case VEPU541_FMT_YUV422SP:
  case VEPU541_FMT_YUV422P:
  case VEPU541_FMT_YUYV422:
  case VEPU541_FMT_UYVY422:
    mb_wd64 = mb_wd64 * 2;
    break;
  default:
    _mpp_log_l(2,"hal_h265e_v540c","invalid src color space: %d\n","vepu540c_h265_setup_hal_bufs",
               (ulong)VVar2);
    return MPP_NOK;
  case VEPU541_FMT_YUV420SP:
  case VEPU541_FMT_YUV420P:
    mb_wd64 = (uint)(mb_wd64 * 3) >> 1;
    break;
  case VEPU540_FMT_YUV400:
  }
  if (ref != (MppEncRefCfg)0x0) {
    pMVar8 = mpp_enc_ref_cfg_get_cpb_info(ref);
    if (pMVar8->dpb_size + 1 < 2) {
      local_94 = 2;
    }
    else {
      local_94 = pMVar8->dpb_size + 1;
    }
    aligned_w = local_94;
  }
  if ((int)uVar4 < 0xc01) {
    if (ctx->ext_line_buf != (MppBuffer)0x0) {
      mpp_buffer_put_with_caller(ctx->ext_line_buf,"vepu540c_h265_setup_hal_bufs");
      ctx->ext_line_buf = (MppBuffer)0x0;
    }
    if (ctx->ext_line_buf_grp != (MppBufferGroup)0x0) {
      mpp_buffer_group_clear(ctx->ext_line_buf_grp);
      mpp_buffer_group_put(ctx->ext_line_buf_grp);
      ctx->ext_line_buf_grp = (MppBufferGroup)0x0;
    }
    ctx->ext_line_buf_size = 0;
  }
  else {
    iVar7 = ((int)uVar4 / 0x20 + -0x5b) * 0x1a0;
    if (ctx->ext_line_buf_grp == (MppBufferGroup)0x0) {
      mpp_buffer_group_get
                (&ctx->ext_line_buf_grp,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_h265e_v540c",
                 "vepu540c_h265_setup_hal_bufs");
    }
    else if (iVar7 != ctx->ext_line_buf_size) {
      mpp_buffer_put_with_caller(ctx->ext_line_buf,"vepu540c_h265_setup_hal_bufs");
      ctx->ext_line_buf = (MppBuffer)0x0;
      mpp_buffer_group_clear(ctx->ext_line_buf_grp);
    }
    if ((ctx->ext_line_buf_grp == (MppBufferGroup)0x0) &&
       (_mpp_log_l(2,"hal_h265e_v540c","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "ctx->ext_line_buf_grp","vepu540c_h265_setup_hal_bufs",0xbb),
       (mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if (ctx->ext_line_buf == (MppBuffer)0x0) {
      mpp_buffer_get_with_tag
                (ctx->ext_line_buf_grp,&ctx->ext_line_buf,(long)iVar7,"hal_h265e_v540c",
                 "vepu540c_h265_setup_hal_bufs");
    }
    ctx->ext_line_buf_size = iVar7;
  }
  if ((ctx->frame_size < (uint)mb_wd64) || (iVar1 < aligned_w)) {
    memset(&local_88,0,0x18);
    hal_bufs_deinit(ctx->dpb_bufs);
    hal_bufs_init(&ctx->dpb_bufs);
    ctx->fbc_header_len = iVar5 * iVar6 * 0x40 + 0x1fffU & 0xffffe000;
    local_88 = (size_t)(ctx->fbc_header_len + (iVar5 * iVar6 * 0x3000) / 2);
    size[0] = (size_t)(iVar5 * iVar6 * 0x100);
    size[1] = (size_t)(int)((iVar5 * iVar6 * 0x40 + 0xffU & 0xffffff00) << 4);
    local_9c = iVar1;
    if (iVar1 < aligned_w) {
      local_9c = aligned_w;
    }
    if ((hal_h265e_debug & 8) != 0) {
      _mpp_log_l(4,"hal_h265e_v540c","frame size %d -> %d max count %d -> %d\n",(char *)0x0,
                 (ulong)ctx->frame_size,(ulong)(uint)mb_wd64,iVar1,local_9c);
    }
    hal_bufs_setup(ctx->dpb_bufs,local_9c,3,&local_88);
    ctx->frame_size = mb_wd64;
    ctx->max_buf_cnt = local_9c;
  }
  if ((hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v540c","(%d) leave\n",(char *)0x0,0xe3);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET vepu540c_h265_setup_hal_bufs(H265eV540cHalContext *ctx)
{
    MPP_RET ret = MPP_OK;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    RK_U32 frame_size;
    Vepu541Fmt input_fmt = VEPU541_FMT_YUV420P;
    RK_S32 mb_wd64, mb_h64;
    MppEncRefCfg ref_cfg = ctx->cfg->ref_cfg;
    MppEncPrepCfg *prep = &ctx->cfg->prep;
    RK_S32 old_max_cnt = ctx->max_buf_cnt;
    RK_S32 new_max_cnt = 2;
    RK_S32 alignment = 32;
    RK_S32 aligned_w = MPP_ALIGN(prep->width,  alignment);

    hal_h265e_enter();

    mb_wd64 = (prep->width + 63) / 64;
    mb_h64 = (prep->height + 63) / 64;

    frame_size = MPP_ALIGN(prep->width, 16) * MPP_ALIGN(prep->height, 16);
    vepu541_set_fmt(fmt, ctx->cfg->prep.format);
    input_fmt = (Vepu541Fmt)fmt->format;
    switch (input_fmt) {
    case VEPU540_FMT_YUV400:
        break;
    case VEPU541_FMT_YUV420P:
    case VEPU541_FMT_YUV420SP: {
        frame_size = frame_size * 3 / 2;
    } break;
    case VEPU541_FMT_YUV422P:
    case VEPU541_FMT_YUV422SP:
    case VEPU541_FMT_YUYV422:
    case VEPU541_FMT_UYVY422:
    case VEPU541_FMT_BGR565: {
        frame_size *= 2;
    } break;
    case VEPU541_FMT_BGR888: {
        frame_size *= 3;
    } break;
    case VEPU541_FMT_BGRA8888: {
        frame_size *= 4;
    } break;
    default: {
        hal_h265e_err("invalid src color space: %d\n", input_fmt);
        return MPP_NOK;
    }
    }

    if (ref_cfg) {
        MppEncCpbInfo *info = mpp_enc_ref_cfg_get_cpb_info(ref_cfg);
        new_max_cnt = MPP_MAX(new_max_cnt, info->dpb_size + 1);
    }

    if (aligned_w > (3 * SZ_1K)) {
        RK_S32 ext_line_buf_size = (aligned_w / 32 - 91) * 26 * 16;

        if (NULL == ctx->ext_line_buf_grp)
            mpp_buffer_group_get_internal(&ctx->ext_line_buf_grp, MPP_BUFFER_TYPE_ION);
        else if (ext_line_buf_size != ctx->ext_line_buf_size) {
            mpp_buffer_put(ctx->ext_line_buf);
            ctx->ext_line_buf = NULL;
            mpp_buffer_group_clear(ctx->ext_line_buf_grp);
        }

        mpp_assert(ctx->ext_line_buf_grp);

        if (NULL == ctx->ext_line_buf)
            mpp_buffer_get(ctx->ext_line_buf_grp, &ctx->ext_line_buf, ext_line_buf_size);

        ctx->ext_line_buf_size = ext_line_buf_size;
    } else {
        if (ctx->ext_line_buf) {
            mpp_buffer_put(ctx->ext_line_buf);
            ctx->ext_line_buf = NULL;
        }

        if (ctx->ext_line_buf_grp) {
            mpp_buffer_group_clear(ctx->ext_line_buf_grp);
            mpp_buffer_group_put(ctx->ext_line_buf_grp);
            ctx->ext_line_buf_grp = NULL;
        }
        ctx->ext_line_buf_size = 0;
    }

    if (frame_size > ctx->frame_size || new_max_cnt > old_max_cnt) {
        size_t size[3] = {0};

        hal_bufs_deinit(ctx->dpb_bufs);
        hal_bufs_init(&ctx->dpb_bufs);

        ctx->fbc_header_len = MPP_ALIGN(((mb_wd64 * mb_h64) << 6), SZ_8K);
        size[0] = ctx->fbc_header_len + ((mb_wd64 * mb_h64) << 12) * 3 / 2; //fbc_h + fbc_b
        size[1] = (mb_wd64 * mb_h64 << 8);
        size[2] = MPP_ALIGN(mb_wd64 * mb_h64 * 16 * 4, 256) * 16;
        new_max_cnt = MPP_MAX(new_max_cnt, old_max_cnt);

        hal_h265e_dbg_detail("frame size %d -> %d max count %d -> %d\n",
                             ctx->frame_size, frame_size, old_max_cnt, new_max_cnt);

        hal_bufs_setup(ctx->dpb_bufs, new_max_cnt, 3, size);

        ctx->frame_size = frame_size;
        ctx->max_buf_cnt = new_max_cnt;
    }
    hal_h265e_leave();
    return ret;
}